

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

void __thiscall CP::list<int>::merge(list<int> *this,list<CP::list<int>_> *ls)

{
  node *pnVar1;
  node *pnVar2;
  size_t sVar3;
  node *pnVar4;
  node *pnVar5;
  node *pnVar6;
  list<int> *l;
  node *pnVar7;
  list<CP::list<int>_> *__range1;
  
  pnVar1 = ls->mHeader;
  pnVar2 = this->mHeader;
  pnVar7 = pnVar1;
  while (pnVar7 = pnVar7->next, pnVar1 != pnVar7) {
    sVar3 = (pnVar7->data).mSize;
    if (sVar3 != 0) {
      pnVar4 = pnVar2->prev;
      pnVar5 = (pnVar7->data).mHeader;
      pnVar6 = pnVar5->next;
      pnVar6->prev = pnVar4;
      pnVar4->next = pnVar6;
      pnVar4 = pnVar5->prev;
      pnVar4->next = pnVar2;
      pnVar2->prev = pnVar4;
      pnVar5->next = pnVar5;
      pnVar5->prev = pnVar5;
      this->mSize = this->mSize + sVar3;
      (pnVar7->data).mSize = 0;
    }
  }
  return;
}

Assistant:

iterator begin() {
      return iterator(mHeader->next);
    }